

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O2

SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
            *this,Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
                  *_rhs)

{
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
  *pSVar1;
  type rhs;
  PointerType local_48;
  long lStack_40;
  PointerType local_30;
  long lStack_28;
  long local_20;
  Nested pMStack_18;
  Index local_10;
  Index IStack_8;
  
  local_48 = (_rhs->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
             .m_data;
  lStack_40 = (_rhs->
              super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
              ).
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,_0>
              .m_rows.m_value;
  local_30 = (_rhs->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_data;
  lStack_28 = ((variable_if_dynamic<long,__1> *)
              ((long)&(_rhs->
                      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                      ).
                      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
                      .m_xpr.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              + 8))->m_value;
  local_20 = ((variable_if_dynamic<long,__1> *)
             ((long)&(_rhs->
                     super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
                     .m_xpr.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             + 0x10))->m_value;
  pMStack_18 = (_rhs->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
               .m_xpr.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_xpr;
  local_10 = (_rhs->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_outerStride;
  IStack_8 = (_rhs->
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             ).
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .m_outerStride;
  pSVar1 = SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
           ::
           lazyAssign<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                     ((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                       *)this,(DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                               *)&local_48);
  return pSVar1;
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }